

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_user(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  char *local_38;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (conn->user == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = conn->user;
  }
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",local_38);
  if (CVar1 == CURLE_OK) {
    _state(data,FTP_USER);
    *(uint *)&(data->state).field_0x660 = *(uint *)&(data->state).field_0x660 & 0xffffffbf;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_user(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = Curl_pp_sendf(data,
                                  &conn->proto.ftpc.pp, "USER %s",
                                  conn->user?conn->user:"");
  if(!result) {
    state(data, FTP_USER);
    data->state.ftp_trying_alternative = FALSE;
  }
  return result;
}